

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

string * __thiscall
helics::CoreBroker::getNameList_abi_cxx11_
          (string *__return_storage_ptr__,CoreBroker *this,string_view gidString)

{
  BasicHandleInfo *pBVar1;
  char *pcVar2;
  ulong uVar3;
  string_view line;
  string_view delimiters;
  vector<int,_std::allocator<int>_> val;
  string local_48;
  
  pcVar2 = gidString._M_str;
  line._M_str = pcVar2 + (*pcVar2 == '[');
  line._M_len = (gidString._M_len - (ulong)(pcVar2[gidString._M_len - 1] == ']')) -
                (ulong)(*pcVar2 == '[');
  delimiters._M_str = ",:;";
  delimiters._M_len = 3;
  gmlc::utilities::str2vector<int>(&val,line,-0x17,delimiters);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (__return_storage_ptr__,'[');
  for (uVar3 = 1;
      uVar3 < (ulong)((long)val.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)val.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar3 = uVar3 + 2) {
    pBVar1 = HandleManager::findHandle
                       (&this->handles,
                        *(GlobalHandle *)
                         (val.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + (uVar3 - 1)));
    if (pBVar1 != (BasicHandleInfo *)0x0) {
      generateJsonQuotedString(&local_48,&pBVar1->key);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(__return_storage_ptr__,',');
    }
  }
  if ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] ==
      ',') {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (__return_storage_ptr__);
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (__return_storage_ptr__,']');
  CLI::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&val.super__Vector_base<int,_std::allocator<int>_>);
  return __return_storage_ptr__;
}

Assistant:

std::string CoreBroker::getNameList(std::string_view gidString) const
{
    if (gidString.back() == ']') {
        gidString.remove_suffix(1);
    }
    if (gidString.front() == '[') {
        gidString.remove_prefix(1);
    }
    auto val = gmlc::utilities::str2vector<int>(gidString, -23, ",:;");
    std::string nameString;
    nameString.push_back('[');
    size_t index = 0;
    while (index + 1 < val.size()) {
        const auto* info = handles.findHandle(
            GlobalHandle(GlobalFederateId(val[index]), InterfaceHandle(val[index + 1])));
        if (info != nullptr) {
            nameString.append(generateJsonQuotedString(info->key));
            nameString.push_back(',');
        }

        index += 2;
    }
    if (nameString.back() == ',') {
        nameString.pop_back();
    }
    nameString.push_back(']');
    return nameString;
}